

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_queue.c
# Opt level: O0

_Bool uo_queue_enqueue(uo_queue *queue,void *item,_Bool should_block)

{
  atomic_size_t *paVar1;
  ulong uVar2;
  int iVar3;
  size_t head;
  _Bool should_block_local;
  void *item_local;
  uo_queue *queue_local;
  
  if (should_block) {
    sem_wait((sem_t *)&queue->enqueue_sem);
  }
  else {
    iVar3 = sem_trywait((sem_t *)&queue->enqueue_sem);
    if (iVar3 == -1) {
      return false;
    }
  }
  LOCK();
  paVar1 = &queue->head;
  uVar2 = *paVar1;
  *paVar1 = *paVar1 + 1;
  UNLOCK();
  queue->items[uVar2 % queue->capasity] = item;
  sem_post((sem_t *)&queue->dequeue_sem);
  return true;
}

Assistant:

bool uo_queue_enqueue(
    uo_queue *queue, 
    void *item, 
    bool should_block)
{
    if (should_block)
        sem_wait((sem_t *)&queue->enqueue_sem);
    else if (sem_trywait((sem_t *)&queue->enqueue_sem) == -1)
        return false;

    size_t head = atomic_fetch_add(&queue->head, 1);
    queue->items[head % queue->capasity] = item;
    sem_post((sem_t *)&queue->dequeue_sem);

    return true;
}